

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::String&,char_const(&)[3],long,char_const(&)[6]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [3],
          long *params_2,char (*params_3) [6])

{
  long lVar1;
  undefined1 local_88 [16];
  ArrayPtr<const_char> local_78;
  long local_68;
  long local_60;
  CappedArray<char,_26UL> local_58;
  
  lVar1 = *(long *)(this + 8);
  local_68 = lVar1;
  if (lVar1 != 0) {
    local_68 = *(long *)this;
  }
  local_60 = 0;
  if (lVar1 != 0) {
    local_60 = lVar1 + -1;
  }
  local_78.size_ = strlen((char *)params);
  local_78.ptr = (char *)params;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(long *)params_1);
  local_88._8_8_ = strlen((char *)params_2);
  local_88._0_8_ = params_2;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_68,&local_78,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_26UL> *)local_88,(ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}